

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

bool tvm::runtime::RuntimeEnabled(string *target)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ostringstream *poVar3;
  ostream *poVar4;
  PackedFunc *pPVar5;
  bool local_29e;
  bool local_29b;
  bool local_298;
  LogMessageFatal local_288;
  undefined1 local_100 [24];
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  PackedFunc *pf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  byte local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  byte local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  string f_name;
  string *target_local;
  
  f_name.field_2._8_8_ = target;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          f_name.field_2._8_8_,"cpu");
  if (bVar1) {
    target_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            f_name.field_2._8_8_,"cuda");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )f_name.field_2._8_8_,"gpu"), bVar1)) {
      std::__cxx11::string::operator=((string *)local_38,"device_api.gpu");
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              f_name.field_2._8_8_,"cl");
      if (((bVar1) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)f_name.field_2._8_8_,"opencl"), bVar1)) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)f_name.field_2._8_8_,"sdaccel"), bVar1)) {
        std::__cxx11::string::operator=((string *)local_38,"device_api.opencl");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )f_name.field_2._8_8_,"gl");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)f_name.field_2._8_8_,"opengl"), bVar1)) {
          std::__cxx11::string::operator=((string *)local_38,"device_api.opengl");
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)f_name.field_2._8_8_,"mtl");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)f_name.field_2._8_8_,"metal"), bVar1)) {
            std::__cxx11::string::operator=((string *)local_38,"device_api.metal");
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)f_name.field_2._8_8_,"vulkan");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)local_38,"device_api.vulkan");
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)f_name.field_2._8_8_,"stackvm");
              if (bVar1) {
                std::__cxx11::string::operator=((string *)local_38,"codegen.build_stackvm");
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)f_name.field_2._8_8_,"rpc");
                if (bVar1) {
                  std::__cxx11::string::operator=((string *)local_38,"device_api.rpc");
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)f_name.field_2._8_8_,"vpi");
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)f_name.field_2._8_8_,"verilog"), bVar1)) {
                    std::__cxx11::string::operator=((string *)local_38,"device_api.vpi");
                  }
                  else {
                    uVar2 = std::__cxx11::string::length();
                    local_69 = 0;
                    local_298 = false;
                    if (4 < uVar2) {
                      std::__cxx11::string::substr((ulong)&local_68,f_name.field_2._8_8_);
                      local_69 = 1;
                      local_298 = std::operator==(&local_68,"nvptx");
                    }
                    if ((local_69 & 1) != 0) {
                      std::__cxx11::string::~string((string *)&local_68);
                    }
                    if (local_298 == false) {
                      uVar2 = std::__cxx11::string::length();
                      local_91 = 0;
                      local_29b = false;
                      if (3 < uVar2) {
                        std::__cxx11::string::substr((ulong)&local_90,f_name.field_2._8_8_);
                        local_91 = 1;
                        local_29b = std::operator==(&local_90,"rocm");
                      }
                      if ((local_91 & 1) != 0) {
                        std::__cxx11::string::~string((string *)&local_90);
                      }
                      if (local_29b == false) {
                        uVar2 = std::__cxx11::string::length();
                        pf._7_1_ = 0;
                        local_29e = false;
                        if (3 < uVar2) {
                          std::__cxx11::string::substr((ulong)&local_b8,f_name.field_2._8_8_);
                          pf._7_1_ = 1;
                          local_29e = std::operator==(&local_b8,"llvm");
                        }
                        if ((pf._7_1_ & 1) != 0) {
                          std::__cxx11::string::~string((string *)&local_b8);
                        }
                        if (local_29e != false) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_e8,"codegen.llvm_target_enabled",
                                     (allocator<char> *)(local_100 + 0x17));
                          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)Registry::Get(&local_e8);
                          std::__cxx11::string::~string((string *)&local_e8);
                          std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0x17));
                          local_c8 = args;
                          if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                            target_local._7_1_ = false;
                          }
                          else {
                            PackedFunc::operator()((PackedFunc *)local_100,args);
                            target_local._7_1_ =
                                 TVMPODValue_::operator_cast_to_bool((TVMPODValue_ *)local_100);
                            TVMRetValue::~TVMRetValue((TVMRetValue *)local_100);
                          }
                          goto LAB_00118542;
                        }
                        dmlc::LogMessageFatal::LogMessageFatal
                                  (&local_288,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
                                   ,0x9b);
                        poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_288);
                        poVar4 = std::operator<<((ostream *)poVar3,"Unknown optional runtime ");
                        std::operator<<(poVar4,(string *)f_name.field_2._8_8_);
                        dmlc::LogMessageFatal::~LogMessageFatal(&local_288);
                      }
                      else {
                        std::__cxx11::string::operator=((string *)local_38,"device_api.rocm");
                      }
                    }
                    else {
                      std::__cxx11::string::operator=((string *)local_38,"device_api.gpu");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pPVar5 = Registry::Get((string *)local_38);
    target_local._7_1_ = pPVar5 != (PackedFunc *)0x0;
  }
LAB_00118542:
  local_48 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return target_local._7_1_;
}

Assistant:

bool RuntimeEnabled(const std::string &target) {
  std::string f_name;
  if (target == "cpu") {
    return true;
  } else if (target == "cuda" || target == "gpu") {
    f_name = "device_api.gpu";
  } else if (target == "cl" || target == "opencl" || target == "sdaccel") {
    f_name = "device_api.opencl";
  } else if (target == "gl" || target == "opengl") {
    f_name = "device_api.opengl";
  } else if (target == "mtl" || target == "metal") {
    f_name = "device_api.metal";
  } else if (target == "vulkan") {
    f_name = "device_api.vulkan";
  } else if (target == "stackvm") {
    f_name = "codegen.build_stackvm";
  } else if (target == "rpc") {
    f_name = "device_api.rpc";
  } else if (target == "vpi" || target == "verilog") {
    f_name = "device_api.vpi";
  } else if (target.length() >= 5 && target.substr(0, 5) == "nvptx") {
    f_name = "device_api.gpu";
  } else if (target.length() >= 4 && target.substr(0, 4) == "rocm") {
    f_name = "device_api.rocm";
  } else if (target.length() >= 4 && target.substr(0, 4) == "llvm") {
    const PackedFunc *pf = runtime::Registry::Get("codegen.llvm_target_enabled");
    if (pf == nullptr)
      return false;
    return (*pf)(target);
  } else {
    LOG(FATAL) << "Unknown optional runtime " << target;
  }
  return runtime::Registry::Get(f_name) != nullptr;
}